

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qpixmap.cpp
# Opt level: O0

bool __thiscall QPixmap::save(QPixmap *this,QString *fileName,char *format,int quality)

{
  bool bVar1;
  undefined4 in_ECX;
  QImageWriter *in_RDX;
  QPixmap *in_RSI;
  QString *in_RDI;
  long in_FS_OFFSET;
  int in_stack_0000000c;
  QImageWriter writer;
  QPixmap *in_stack_ffffffffffffffa0;
  undefined4 in_stack_ffffffffffffffb0;
  QPixmap *this_00;
  bool local_29;
  QByteArray local_28;
  undefined1 *local_10;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  bVar1 = isNull(in_stack_ffffffffffffffa0);
  if (bVar1) {
    local_29 = false;
  }
  else {
    local_10 = &DAT_aaaaaaaaaaaaaaaa;
    this_00 = in_RSI;
    QByteArray::QByteArray(&local_28,(char *)in_RDX,-1);
    QImageWriter::QImageWriter
              ((QImageWriter *)CONCAT44(in_ECX,in_stack_ffffffffffffffb0),in_RDI,
               (QByteArray *)in_RSI);
    QByteArray::~QByteArray((QByteArray *)0x321daf);
    local_29 = doImageIO(this_00,in_RDX,in_stack_0000000c);
    QImageWriter::~QImageWriter((QImageWriter *)CONCAT44(in_ECX,in_stack_ffffffffffffffb0));
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return local_29;
  }
  __stack_chk_fail();
}

Assistant:

bool QPixmap::save(const QString &fileName, const char *format, int quality) const
{
    if (isNull())
        return false;                                // nothing to save
    QImageWriter writer(fileName, format);
    return doImageIO(&writer, quality);
}